

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

void __thiscall
qclab::dense::SquareMatrix<double>::SquareMatrix
          (SquareMatrix<double> *this,double m00,double m01,double m10,double m11)

{
  type pdVar1;
  double m11_local;
  double m10_local;
  double m01_local;
  double m00_local;
  SquareMatrix<double> *this_local;
  
  this->size_ = 2;
  alloc_unique_array<double>((dense *)&this->data_,4);
  pdVar1 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[](&this->data_,0);
  *pdVar1 = m00;
  pdVar1 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[](&this->data_,1);
  *pdVar1 = m10;
  pdVar1 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[](&this->data_,2);
  *pdVar1 = m01;
  pdVar1 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[](&this->data_,3);
  *pdVar1 = m11;
  return;
}

Assistant:

SquareMatrix( const T m00 , const T m01 ,
                      const T m10 , const T m11 )
        : size_( 2 )
        , data_( alloc_unique_array< T >( 4 ) )
        {
          data_[0] = m00 ; data_[1] = m10 ;
          data_[2] = m01 ; data_[3] = m11 ;
        }